

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

bool __thiscall
GlobOpt::DoArrayCheckHoist(GlobOpt *this,ValueType baseValueType,Loop *loop,Instr *instr)

{
  bool bVar1;
  ImplicitCallFlags local_31;
  Instr *instr_local;
  Loop *loop_local;
  GlobOpt *this_local;
  ValueType baseValueType_local;
  
  this_local._4_2_ = baseValueType.field_0;
  bVar1 = DoArrayCheckHoist(this);
  if ((!bVar1) ||
     (((instr != (Instr *)0x0 && (bVar1 = IsLoopPrePass(this), !bVar1)) &&
      (bVar1 = IR::Instr::DoStackArgsOpt(instr), bVar1)))) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = ValueType::IsLikelyArrayOrObjectWithArray((ValueType *)((long)&this_local + 4));
    if ((bVar1) ||
       (bVar1 = ValueType::IsLikelyOptimizedVirtualTypedArray((ValueType *)((long)&this_local + 4)),
       bVar1)) {
      if (loop == (Loop *)0x0) {
        bVar1 = ImplicitCallFlagsAllowOpts(this->func);
      }
      else {
        bVar1 = ImplicitCallFlagsAllowOpts(loop);
      }
      if (!bVar1) {
        if (loop == (Loop *)0x0) {
          local_31 = this->func->m_fg->implicitCallFlags;
        }
        else {
          local_31 = Loop::GetImplicitCallFlags(loop);
        }
        if (((local_31 & ~ImplicitCall_External) == ImplicitCall_HasNoInfo) &&
           (bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,HostOptPhase), bVar1)) {
          Output::Print(L"DoArrayCheckHoist disabled for JS arrays because of external: ");
          Func::DumpFullFunctionName(this->func);
          Output::Print(L"\n");
          Output::Flush();
        }
        return false;
      }
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool
GlobOpt::DoArrayCheckHoist(const ValueType baseValueType, Loop* loop, IR::Instr const * const instr) const
{
    if(!DoArrayCheckHoist() || (instr && !IsLoopPrePass() && instr->DoStackArgsOpt()))
    {
        return false;
    }

    // This includes typed arrays, but not virtual typed arrays, whose vtable can change if the buffer goes away.
    // Note that in the virtual case the vtable check is the only way to catch this, since there's no bound check.
    if(!(baseValueType.IsLikelyArrayOrObjectWithArray() || baseValueType.IsLikelyOptimizedVirtualTypedArray()) ||
        (loop ? ImplicitCallFlagsAllowOpts(loop) : ImplicitCallFlagsAllowOpts(func)))
    {
        return true;
    }

    // The function or loop does not allow disabling implicit calls, which is required to eliminate redundant JS array checks
#if DBG_DUMP
    if((((loop ? loop->GetImplicitCallFlags() : func->m_fg->implicitCallFlags) & ~Js::ImplicitCall_External) == 0) &&
        Js::Configuration::Global.flags.Trace.IsEnabled(Js::HostOptPhase))
    {
        Output::Print(_u("DoArrayCheckHoist disabled for JS arrays because of external: "));
        func->DumpFullFunctionName();
        Output::Print(_u("\n"));
        Output::Flush();
    }
#endif
    return false;
}